

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O3

void Expression_Term(KonohaContext *kctx,KonohaStack *sfp)

{
  int beginIdx;
  kNameSpace *pkVar1;
  kException *tokenList;
  kint_t kVar2;
  kint_t kVar3;
  KClass *pKVar4;
  kObjectVar *pkVar5;
  int iVar6;
  kSyntax *pkVar7;
  kNameSpace *pkVar8;
  kNameSpace *ns;
  kTokenVar *token;
  KClass *foundClass;
  KClass *local_38;
  
  pkVar1 = sfp[1].field_0.asNameSpace;
  tokenList = sfp[3].field_0.asException;
  beginIdx = *(int *)&sfp[4].field_1;
  kVar2 = sfp[5].field_1.intValue;
  kVar3 = sfp[6].field_1.intValue;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"Expression_Term",200,"tracing..");
  iVar6 = (int)kVar2;
  if (beginIdx == iVar6) {
    pKVar4 = *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x58);
    pkVar8 = pkVar1;
    do {
      ns = (kNameSpace *)pkVar8->importedNameSpaceList;
      if ((((kNameSpace *)pkVar8->importedNameSpaceList)->h).ct == pKVar4) break;
      pkVar8 = *(kNameSpace **)&pkVar8->packageId;
      ns = pkVar8;
    } while ((pkVar8->h).ct != pKVar4);
    pkVar5 = (kObjectVar *)
             ((anon_union_8_14_74a59a6a_for_kArrayVar_2 *)&tokenList->uline)->unboxItems[iVar6];
    local_38 = (KClass *)0x0;
    iVar6 = ParseTypePattern(kctx,ns,(kArray *)tokenList,beginIdx,(int)kVar3,&local_38);
    if (local_38 == (KClass *)0x0) {
      iVar6 = beginIdx + 1;
    }
    else {
      *(ktypeattr_t *)((long)&pkVar5->field_1 + 0x1c) = local_38->typeId;
      pkVar7 = (*kctx->klib->kNameSpace_GetSyntax)(kctx,ns,0xe0000006);
      (pkVar5->field_1).fieldObjectItems[4] = (kObject *)pkVar7;
    }
    (*(kctx->platApi->GCModule).UpdateObjectField)
              ((kObjectVar *)pkVar1,(kObjectVar *)pkVar1->NameSpaceConstList,pkVar5);
    pkVar1->NameSpaceConstList = (kArray *)pkVar5;
    (pkVar1->constTable).data.bytesize = (size_t)(pkVar5->field_1).fieldObjectItems[4];
    sfp[-4].field_1 = (anon_union_8_10_3f923e25_for_KonohaValueVar_2)(long)iVar6;
  }
  else {
    sfp[-4].field_1.unboxValue = 0xffffffffffffffff;
  }
  return;
}

Assistant:

static KMETHOD Expression_Term(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_Expression(node, tokenList, beginIdx, opIdx, endIdx);
	if(beginIdx == opIdx) {
		kNameSpace *ns = kNode_ns(node);
		kToken *tk = tokenList->TokenItems[opIdx];
		KClass *foundClass = NULL;
		int nextIdx = ParseTypePattern(kctx, ns, tokenList, beginIdx, endIdx, &foundClass);
		if(foundClass != NULL) {
			kToken_SetTypeId(kctx, tk, ns, foundClass->typeId);
		}
		else {
			nextIdx = opIdx + 1;
		}
		kNode_Termnize(kctx, node, tk);
		KReturnUnboxValue(nextIdx);
	}
	KReturnUnboxValue(-1);
}